

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_loadfile(lua_State *L)

{
  int iVar1;
  int status;
  char *filename;
  char *mode;
  
  filename = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  mode = luaL_optlstring(L,2,(char *)0x0,(size_t *)0x0);
  iVar1 = lua_type(L,3);
  status = luaL_loadfilex(L,filename,mode);
  iVar1 = load_aux(L,status,(uint)(iVar1 != -1) * 3);
  return iVar1;
}

Assistant:

static int luaB_loadfile (lua_State *L) {
  const char *fname = luaL_optstring(L, 1, NULL);
  const char *mode = luaL_optstring(L, 2, NULL);
  int env = (!lua_isnone(L, 3) ? 3 : 0);  /* 'env' index or 0 if no 'env' */
  int status = luaL_loadfilex(L, fname, mode);
  return load_aux(L, status, env);
}